

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O1

int Abc_NtkSpeedupNode_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  
  pAVar2 = pNode->pNtk;
  iVar5 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,in_EDX);
  if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar5] == iVar1) {
    return 1;
  }
  uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar4 == 2) {
    return 0;
  }
  if (uVar4 == 5) {
    return 0;
  }
  if (uVar4 != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                  ,0x163,"int Abc_NtkSpeedupNode_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  iVar5 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
  if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar5] = iVar1;
  iVar5 = Abc_NtkSpeedupNode_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vNodes);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = Abc_NtkSpeedupNode_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vNodes);
  if (iVar5 == 0) {
    return 0;
  }
  uVar4 = vNodes->nCap;
  if (vNodes->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar6;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar4 * 2;
      if (iVar5 <= (int)uVar4) goto LAB_00312d19;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
      }
      vNodes->pArray = ppvVar6;
    }
    vNodes->nCap = iVar5;
  }
LAB_00312d19:
  iVar5 = vNodes->nSize;
  vNodes->nSize = iVar5 + 1;
  vNodes->pArray[iVar5] = pNode;
  return 1;
}

Assistant:

int Abc_NtkSpeedupNode_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    Abc_NodeSetTravIdCurrent( pNode );
    if ( !Abc_NtkSpeedupNode_rec( Abc_ObjFanin0(pNode), vNodes ) )
        return 0;
    if ( !Abc_NtkSpeedupNode_rec( Abc_ObjFanin1(pNode), vNodes ) )
        return 0;
    Vec_PtrPush( vNodes, pNode );
    return 1;
}